

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddCols(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *set,bool scale)

{
  int iVar1;
  int iVar2;
  pointer pnVar3;
  Item *pIVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  undefined8 uVar7;
  bool bVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  pointer pnVar15;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar16;
  undefined4 *puVar17;
  soplex *psVar18;
  uint *puVar19;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar20;
  long lVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  int iVar23;
  Item *pIVar24;
  long in_FS_OFFSET;
  byte bVar25;
  DataArray<int> newRows;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  empty;
  DataArray<int> local_430;
  long local_418;
  DataArray<int> *local_410;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_408;
  DataKey local_400;
  undefined4 local_3f8;
  uint uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  double local_3e8;
  undefined8 uStack_3e0;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_3d8;
  soplex local_230 [112];
  undefined4 local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  soplex local_1b0 [112];
  int local_140;
  undefined1 local_13c;
  undefined8 local_138;
  soplex local_130 [112];
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  soplex local_b0 [112];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar25 = 0;
  local_418 = (long)(this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
  iVar1 = (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_430.data = (int *)0x0;
  local_430.memFactor = 1.2;
  local_430.thesize = 0;
  if (0 < iVar1) {
    local_430.thesize = iVar1;
  }
  local_430.themax = 1;
  if (0 < iVar1) {
    local_430.themax = local_430.thesize;
  }
  spx_alloc<int*>(&local_430.data,local_430.themax);
  if (&this->
       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      != set) {
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add(&this->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ,set);
  }
  iVar23 = (this->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  lVar10 = (long)iVar23;
  if (0 < lVar10) {
    memset(local_430.data + ((lVar10 + -1) - (ulong)(iVar23 - 1)),0,lVar10 * 4);
  }
  lVar10 = (long)(set->
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).set.thenum;
  if (0 < lVar10) {
    do {
      pIVar24 = (set->
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).set.theitem;
      iVar23 = (set->
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).set.thekey[lVar10 + -1].idx;
      lVar21 = (long)pIVar24[iVar23].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
      if (0 < lVar21) {
        do {
          iVar2 = pIVar24[iVar23].data.
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem[lVar21 + -1].idx;
          if ((this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum <= iVar2) {
            LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::LPRowBase(&local_3d8,0);
            DataArray<int>::reSize(&local_430,iVar2 + 1);
            iVar14 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum;
            lVar13 = (long)iVar14;
            if (iVar14 <= iVar2) {
              iVar14 = (iVar2 - iVar14) + 1;
              do {
                local_430.data[lVar13] = 0;
                local_400.info = 0;
                local_400.idx = -1;
                LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add(&this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ,&local_400,&local_3d8);
                lVar13 = lVar13 + 1;
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
            }
            local_3d8.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006b38e0;
            if (local_3d8.vec.theelem !=
                (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0) {
              free(local_3d8.vec.theelem);
              local_3d8.vec.theelem =
                   (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0;
            }
          }
          local_430.data[iVar2] = local_430.data[iVar2] + 1;
          bVar8 = 1 < lVar21;
          lVar21 = lVar21 + -1;
        } while (bVar8);
      }
      bVar8 = 1 < lVar10;
      lVar10 = lVar10 + -1;
    } while (bVar8);
  }
  if (0 < (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar10 = 0;
    do {
      if (0 < local_430.data[lVar10]) {
        pIVar24 = (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem +
                  (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[lVar10].idx;
        iVar23 = local_430.data[lVar10] +
                 (pIVar24->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::xtend((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)this,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)pIVar24,iVar23);
        (this->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.theitem
        [(this->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thekey[lVar10].idx].data.
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .memused = iVar23;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  iVar23 = (this->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  if ((int)local_418 < iVar23) {
    local_410 = &(this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).scaleExp;
    local_3e8 = *(double *)(in_FS_OFFSET + -8);
    local_3f8 = SUB84(local_3e8,0);
    uStack_3e0 = 0;
    uStack_3f4 = (uint)((ulong)local_3e8 >> 0x20) ^ 0x80000000;
    uStack_3f0 = 0;
    uStack_3ec = 0x80000000;
    lVar10 = local_418;
    local_408 = this;
    do {
      if (this->thesense == MAXIMIZE) {
        local_3d8.left.m_backend.data._M_elems[0] = 1;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
        ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                      *)((this->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar10),(int *)&local_3d8);
      }
      else {
        local_3d8.left.m_backend.data._M_elems[0] = 0xffffffff;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
        ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                      *)((this->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar10),(int *)&local_3d8);
      }
      pIVar24 = (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[lVar10].idx;
      uVar9 = 0;
      if (scale) {
        uVar9 = (*this->lp_scaler->_vptr_SPxScaler[1])(this->lp_scaler,pIVar24,local_410);
        pcVar22 = &(this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar10].m_backend;
        ::soplex::infinity::__tls_init();
        local_3d8.left.m_backend.fpclass = cpp_dec_float_finite;
        local_3d8.left.m_backend.prec_elem = 0x1c;
        local_3d8.left.m_backend.data._M_elems[0] = 0;
        local_3d8.left.m_backend.data._M_elems[1] = 0;
        local_3d8.left.m_backend.data._M_elems[2] = 0;
        local_3d8.left.m_backend.data._M_elems[3] = 0;
        local_3d8.left.m_backend.data._M_elems[4] = 0;
        local_3d8.left.m_backend.data._M_elems[5] = 0;
        local_3d8.left.m_backend.data._M_elems[6] = 0;
        local_3d8.left.m_backend.data._M_elems[7] = 0;
        local_3d8.left.m_backend.data._M_elems[8] = 0;
        local_3d8.left.m_backend.data._M_elems[9] = 0;
        local_3d8.left.m_backend.data._M_elems[10] = 0;
        local_3d8.left.m_backend.data._M_elems[0xb] = 0;
        local_3d8.left.m_backend.data._M_elems[0xc] = 0;
        local_3d8.left.m_backend.data._M_elems[0xd] = 0;
        local_3d8.left.m_backend.data._M_elems[0xe] = 0;
        local_3d8.left.m_backend.data._M_elems[0xf] = 0;
        local_3d8.left.m_backend.data._M_elems[0x10] = 0;
        local_3d8.left.m_backend.data._M_elems[0x11] = 0;
        local_3d8.left.m_backend.data._M_elems[0x12] = 0;
        local_3d8.left.m_backend.data._M_elems[0x13] = 0;
        local_3d8.left.m_backend.data._M_elems[0x14] = 0;
        local_3d8.left.m_backend.data._M_elems[0x15] = 0;
        local_3d8.left.m_backend.data._M_elems[0x16] = 0;
        local_3d8.left.m_backend.data._M_elems[0x17] = 0;
        local_3d8.left.m_backend.data._M_elems[0x18] = 0;
        local_3d8.left.m_backend.data._M_elems[0x19] = 0;
        local_3d8.left.m_backend.data._M_elems._104_5_ = 0;
        local_3d8.left.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        local_3d8.left.m_backend.exp = 0;
        local_3d8.left.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_3d8,local_3e8);
        if ((pcVar22->fpclass != cpp_dec_float_NaN) &&
           (local_3d8.left.m_backend.fpclass != cpp_dec_float_NaN)) {
          iVar23 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (pcVar22,(cpp_dec_float<200U,_int,_void> *)&local_3d8);
          if (iVar23 < 0) {
            pnVar3 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar15 = pnVar3 + lVar10;
            psVar18 = local_b0;
            for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
              *(undefined4 *)psVar18 = (pnVar15->m_backend).data._M_elems[0];
              pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar25 * -2 + 1) * 4);
              psVar18 = psVar18 + (ulong)bVar25 * -8 + 4;
            }
            local_40 = pnVar3[lVar10].m_backend.exp;
            local_3c = pnVar3[lVar10].m_backend.neg;
            local_38._0_4_ = pnVar3[lVar10].m_backend.fpclass;
            local_38._4_4_ = pnVar3[lVar10].m_backend.prec_elem;
            spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_3d8,local_b0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)(ulong)-uVar9,CONCAT31((int3)((uint)local_40 >> 8),local_3c));
            pnVar3 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pLVar16 = &local_3d8;
            pnVar15 = pnVar3 + lVar10;
            for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
              (pnVar15->m_backend).data._M_elems[0] = (pLVar16->left).m_backend.data._M_elems[0];
              pLVar16 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pLVar16 + ((ulong)bVar25 * -2 + 1) * 4);
              pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar25 * -2 + 1) * 4);
            }
            pnVar3[lVar10].m_backend.exp = local_3d8.left.m_backend.exp;
            pnVar3[lVar10].m_backend.neg = local_3d8.left.m_backend.neg;
            pnVar3[lVar10].m_backend.fpclass = local_3d8.left.m_backend.fpclass;
            pnVar3[lVar10].m_backend.prec_elem = local_3d8.left.m_backend.prec_elem;
          }
        }
        pcVar22 = &(this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar10].m_backend;
        ::soplex::infinity::__tls_init();
        local_3d8.left.m_backend.fpclass = cpp_dec_float_finite;
        local_3d8.left.m_backend.prec_elem = 0x1c;
        local_3d8.left.m_backend.data._M_elems[0] = 0;
        local_3d8.left.m_backend.data._M_elems[1] = 0;
        local_3d8.left.m_backend.data._M_elems[2] = 0;
        local_3d8.left.m_backend.data._M_elems[3] = 0;
        local_3d8.left.m_backend.data._M_elems[4] = 0;
        local_3d8.left.m_backend.data._M_elems[5] = 0;
        local_3d8.left.m_backend.data._M_elems[6] = 0;
        local_3d8.left.m_backend.data._M_elems[7] = 0;
        local_3d8.left.m_backend.data._M_elems[8] = 0;
        local_3d8.left.m_backend.data._M_elems[9] = 0;
        local_3d8.left.m_backend.data._M_elems[10] = 0;
        local_3d8.left.m_backend.data._M_elems[0xb] = 0;
        local_3d8.left.m_backend.data._M_elems[0xc] = 0;
        local_3d8.left.m_backend.data._M_elems[0xd] = 0;
        local_3d8.left.m_backend.data._M_elems[0xe] = 0;
        local_3d8.left.m_backend.data._M_elems[0xf] = 0;
        local_3d8.left.m_backend.data._M_elems[0x10] = 0;
        local_3d8.left.m_backend.data._M_elems[0x11] = 0;
        local_3d8.left.m_backend.data._M_elems[0x12] = 0;
        local_3d8.left.m_backend.data._M_elems[0x13] = 0;
        local_3d8.left.m_backend.data._M_elems[0x14] = 0;
        local_3d8.left.m_backend.data._M_elems[0x15] = 0;
        local_3d8.left.m_backend.data._M_elems[0x16] = 0;
        local_3d8.left.m_backend.data._M_elems[0x17] = 0;
        local_3d8.left.m_backend.data._M_elems[0x18] = 0;
        local_3d8.left.m_backend.data._M_elems[0x19] = 0;
        local_3d8.left.m_backend.data._M_elems._104_5_ = 0;
        local_3d8.left.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        local_3d8.left.m_backend.exp = 0;
        local_3d8.left.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_3d8,(double)CONCAT44(uStack_3f4,local_3f8)
                  );
        if ((pcVar22->fpclass != cpp_dec_float_NaN) &&
           (local_3d8.left.m_backend.fpclass != cpp_dec_float_NaN)) {
          iVar23 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (pcVar22,(cpp_dec_float<200U,_int,_void> *)&local_3d8);
          if (0 < iVar23) {
            pnVar3 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar15 = pnVar3 + lVar10;
            psVar18 = local_130;
            for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
              *(undefined4 *)psVar18 = (pnVar15->m_backend).data._M_elems[0];
              pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar25 * -2 + 1) * 4);
              psVar18 = psVar18 + (ulong)bVar25 * -8 + 4;
            }
            local_c0 = pnVar3[lVar10].m_backend.exp;
            local_bc = pnVar3[lVar10].m_backend.neg;
            local_b8._0_4_ = pnVar3[lVar10].m_backend.fpclass;
            local_b8._4_4_ = pnVar3[lVar10].m_backend.prec_elem;
            spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_3d8,local_130,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)(ulong)-uVar9,CONCAT31((int3)((uint)local_c0 >> 8),local_bc));
            pnVar3 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pLVar16 = &local_3d8;
            pnVar15 = pnVar3 + lVar10;
            for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
              (pnVar15->m_backend).data._M_elems[0] = (pLVar16->left).m_backend.data._M_elems[0];
              pLVar16 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pLVar16 + ((ulong)bVar25 * -2 + 1) * 4);
              pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar25 * -2 + 1) * 4);
            }
            pnVar3[lVar10].m_backend.exp = local_3d8.left.m_backend.exp;
            pnVar3[lVar10].m_backend.neg = local_3d8.left.m_backend.neg;
            pnVar3[lVar10].m_backend.fpclass = local_3d8.left.m_backend.fpclass;
            pnVar3[lVar10].m_backend.prec_elem = local_3d8.left.m_backend.prec_elem;
          }
        }
        pnVar3 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar15 = pnVar3 + lVar10;
        psVar18 = local_1b0;
        for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
          *(undefined4 *)psVar18 = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar25 * -2 + 1) * 4);
          psVar18 = psVar18 + (ulong)bVar25 * -8 + 4;
        }
        local_140 = pnVar3[lVar10].m_backend.exp;
        local_13c = pnVar3[lVar10].m_backend.neg;
        local_138._0_4_ = pnVar3[lVar10].m_backend.fpclass;
        local_138._4_4_ = pnVar3[lVar10].m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_3d8,local_1b0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)uVar9,CONCAT31((int3)((uint)local_140 >> 8),local_13c));
        pnVar3 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pLVar16 = &local_3d8;
        pnVar15 = pnVar3 + lVar10;
        for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
          (pnVar15->m_backend).data._M_elems[0] = (pLVar16->left).m_backend.data._M_elems[0];
          pLVar16 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pLVar16 + ((ulong)bVar25 * -2 + 1) * 4);
          pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar25 * -2 + 1) * 4);
        }
        pnVar3[lVar10].m_backend.exp = local_3d8.left.m_backend.exp;
        pnVar3[lVar10].m_backend.neg = local_3d8.left.m_backend.neg;
        pnVar3[lVar10].m_backend.fpclass = local_3d8.left.m_backend.fpclass;
        pnVar3[lVar10].m_backend.prec_elem = local_3d8.left.m_backend.prec_elem;
        (this->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).scaleExp.data[lVar10] = uVar9;
      }
      lVar21 = (long)(pIVar24->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
      if (0 < lVar21) {
        lVar13 = lVar21 + 1;
        lVar21 = lVar21 * 0x84;
        do {
          iVar23 = *(int *)((long)(((pIVar24->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val).m_backend.data._M_elems + lVar21 + -4);
          pIVar4 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem;
          iVar2 = (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[iVar23].idx;
          lVar11 = (long)pIVar4[iVar2].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused - (long)local_430.data[iVar23];
          local_430.data[iVar23] = local_430.data[iVar23] + -1;
          pIVar4[iVar2].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .m_elem[lVar11].idx = (int)lVar10;
          if (scale) {
            pNVar5 = (pIVar24->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            puVar17 = (undefined4 *)((long)pNVar5[-1].val.m_backend.data._M_elems + lVar21);
            psVar18 = local_230;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              *(undefined4 *)psVar18 = *puVar17;
              puVar17 = puVar17 + (ulong)bVar25 * -2 + 1;
              psVar18 = psVar18 + (ulong)bVar25 * -8 + 4;
            }
            local_1c0 = *(undefined4 *)
                         ((long)(pNVar5->val).m_backend.data._M_elems + lVar21 + -0x14);
            local_1bc = *(undefined1 *)
                         ((long)(pNVar5->val).m_backend.data._M_elems + lVar21 + -0x10);
            local_1b8 = *(undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar21 + -0xc)
            ;
            spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_3d8,local_230,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)(ulong)((this->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).scaleExp.data[iVar23] + uVar9),
                       CONCAT31((int3)((uint)local_1c0 >> 8),local_1bc));
            pNVar5 = (pIVar24->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pLVar16 = &local_3d8;
            puVar19 = (uint *)((long)pNVar5[-1].val.m_backend.data._M_elems + lVar21);
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              *puVar19 = (pLVar16->left).m_backend.data._M_elems[0];
              pLVar16 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pLVar16 + ((ulong)bVar25 * -2 + 1) * 4);
              puVar19 = puVar19 + (ulong)bVar25 * -2 + 1;
            }
            *(int *)((long)(pNVar5->val).m_backend.data._M_elems + lVar21 + -0x14) =
                 local_3d8.left.m_backend.exp;
            *(bool *)((long)(pNVar5->val).m_backend.data._M_elems + lVar21 + -0x10) =
                 local_3d8.left.m_backend.neg;
            *(undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar21 + -0xc) =
                 local_3d8.left.m_backend._120_8_;
            this = local_408;
          }
          pNVar5 = (pIVar24->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pNVar6 = pIVar4[iVar2].data.
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          puVar17 = (undefined4 *)((long)pNVar5[-1].val.m_backend.data._M_elems + lVar21);
          pNVar20 = pNVar6 + lVar11;
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pNVar20->val).m_backend.data._M_elems[0] = *puVar17;
            puVar17 = puVar17 + (ulong)bVar25 * -2 + 1;
            pNVar20 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)pNVar20 + ((ulong)bVar25 * -2 + 1) * 4);
          }
          pNVar6[lVar11].val.m_backend.exp =
               *(int *)((long)(pNVar5->val).m_backend.data._M_elems + lVar21 + -0x14);
          pNVar6[lVar11].val.m_backend.neg =
               *(bool *)((long)(pNVar5->val).m_backend.data._M_elems + lVar21 + -0x10);
          uVar7 = *(undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar21 + -0xc);
          pNVar6[lVar11].val.m_backend.fpclass = (int)uVar7;
          pNVar6[lVar11].val.m_backend.prec_elem = (int)((ulong)uVar7 >> 0x20);
          lVar13 = lVar13 + -1;
          lVar21 = lVar21 + -0x84;
        } while (1 < lVar13);
      }
      lVar10 = lVar10 + 1;
      iVar23 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
    } while (lVar10 < iVar23);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])(this,(ulong)(uint)(iVar23 - (int)local_418));
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - iVar1));
  if (local_430.data != (int *)0x0) {
    free(local_430.data);
  }
  return;
}

Assistant:

void doAddCols(const LPColSetBase<R>& set, bool scale = false)
   {
      int i, j;
      int oldColNumber = nCols();
      int oldRowNumber = nRows();
      DataArray < int > newRows(nRows());

      if(&set != this)
         LPColSetBase<R>::add(set);

      assert(LPColSetBase<R>::isConsistent());
      assert(LPRowSetBase<R>::isConsistent());

      // count additional nonzeros per row
      for(i = nRows() - 1; i >= 0; --i)
         newRows[i] = 0;

      for(i = set.num() - 1; i >= 0; --i)
      {
         const SVectorBase<R>& vec = set.colVector(i);

         for(j = vec.size() - 1; j >= 0; --j)
         {
            // create new rows if required
            int l = vec.index(j);

            if(l >= nRows())
            {
               LPRowBase<R> empty;
               newRows.reSize(l + 1);

               for(int k = nRows(); k <= l; ++k)
               {
                  newRows[k] = 0;
                  LPRowSetBase<R>::add(empty);
               }

            }

            assert(l < nRows());
            newRows[l]++;
         }
      }

      // extend rows as required
      for(i = 0; i < nRows(); ++i)
      {
         if(newRows[i] > 0)
         {
            int len = newRows[i] + rowVector(i).size();
            LPRowSetBase<R>::xtend(i, len);
            rowVector_w(i).set_size(len);
         }
      }

      // insert new elements to row file
      for(i = oldColNumber; i < nCols(); ++i)
      {
         // @todo: Is there a better way to write the following if, else?
         if(thesense == MAXIMIZE)
         {
            LPColSetBase<R>::maxObj_w(i) *= 1;
         }
         else                  // thesense is MINIMIZE = -1
         {
            LPColSetBase<R>::maxObj_w(i) *= -1;
         }

         SVectorBase<R>& vec = colVector_w(i);
         int newColScaleExp = 0;

         DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

         // compute new column scaling factor and apply it to the bounds
         if(scale)
         {
            newColScaleExp = lp_scaler->computeScaleExp(vec, rowscaleExp);

            if(upper(i) < R(infinity))
               upper_w(i) = spxLdexp(upper_w(i), - newColScaleExp);

            if(lower(i) > R(-infinity))
               lower_w(i) = spxLdexp(lower_w(i), - newColScaleExp);

            maxObj_w(i) = spxLdexp(maxObj_w(i), newColScaleExp);

            LPColSetBase<R>::scaleExp[i] = newColScaleExp;
         }

         for(j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            SVectorBase<R>& row = rowVector_w(k);
            int idx = row.size() - newRows[k];
            assert(newRows[k] > 0);
            newRows[k]--;
            row.index(idx) = i;

            // apply new column and existing row scaling factors to both ColSet and RowSet
            if(scale)
               vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[k]);

            row.value(idx) = vec.value(j);
         }
      }

#ifndef NDEBUG

      for(i = 0; i < nRows(); ++i)
         assert(newRows[i] == 0);

#endif

      assert(SPxLPBase<R>::isConsistent());

      assert(set.num() == nCols() - oldColNumber);
      addedCols(nCols() - oldColNumber);
      addedRows(nRows() - oldRowNumber);
   }